

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>
                   (string *__return_storage_ptr__,char (*a) [8],char **b,char (*args) [21],
                   char **args_1,char (*args_2) [28],char **args_3,char (*args_4) [156],
                   char **args_5,char (*args_6) [73],char **args_7,char (*args_8) [75])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_3b8;
  cmAlphaNum local_380;
  cmAlphaNum local_348;
  cmAlphaNum local_310;
  cmAlphaNum local_2d8;
  cmAlphaNum local_2a0;
  cmAlphaNum local_268;
  cmAlphaNum local_230;
  cmAlphaNum local_1f8;
  cmAlphaNum local_1c0;
  cmAlphaNum local_188;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_150;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_138;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_120;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [28];
  char (*args_local_2) [28];
  char **args_local_1;
  char (*args_local) [21];
  char **b_local;
  char (*a_local) [8];
  
  local_38 = args_2;
  args_local_2 = (char (*) [28])args_1;
  args_local_1 = (char **)args;
  args_local = (char (*) [21])b;
  b_local = (char **)a;
  a_local = (char (*) [8])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_188,*a);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_150,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_188);
  cmAlphaNum::cmAlphaNum(&local_1c0,*(char **)*args_local);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_138,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_1c0);
  cmAlphaNum::cmAlphaNum(&local_1f8,(char *)args_local_1);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_120,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_1f8);
  cmAlphaNum::cmAlphaNum(&local_230,*(char **)*args_local_2);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_108,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_230);
  cmAlphaNum::cmAlphaNum(&local_268,*local_38);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_f0,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_268);
  cmAlphaNum::cmAlphaNum(&local_2a0,*args_3);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_d8,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_2a0);
  cmAlphaNum::cmAlphaNum(&local_2d8,*args_4);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_2d8);
  cmAlphaNum::cmAlphaNum(&local_310,*args_5);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_310);
  cmAlphaNum::cmAlphaNum(&local_348,*args_6);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_348);
  cmAlphaNum::cmAlphaNum(&local_380,*args_7);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_380);
  cmAlphaNum::cmAlphaNum(&local_3b8,*args_8);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const(&)[8],char_const*&&,char_const(&)[21],char_const*&&,char_const(&)[28],char_const*&&,char_const(&)[156],char_const*&&,char_const(&)[73],char_const*&&,char_const(&)[75])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>(char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[],char_const*&&,char_const&[])
              ::makePair,&local_3b8);
  local_48 = &local_150;
  local_40 = 0xb;
  views._M_len = 0xb;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}